

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_nister_main
               (Matrix<double,_9,_4,_0,_9,_4> *EE,essentials_t *essentials)

{
  undefined1 auVar1 [16];
  iterator __position;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *this;
  double *pdVar16;
  undefined8 *puVar17;
  Index size;
  long lVar18;
  Index index_1;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  Index row;
  double dVar23;
  double dVar24;
  long lVar25;
  double *pdVar26;
  ulong uVar27;
  ulong uVar28;
  double *pdVar29;
  ulong uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  MatrixXd norms;
  vector<double,_std::allocator<double>_> roots;
  MatrixXd EvecNorms;
  essential_t essential;
  MatrixXd Evec;
  double y;
  double x;
  Sturm sturmSequence;
  Matrix<double,_1,_4,_1,_1,_4> b22;
  Matrix<double,_1,_11,_1,_1,_11> p_order10;
  Matrix<double,_1,_4,_1,_1,_4> b32;
  Matrix<double,_1,_4,_1,_1,_4> b12;
  Matrix<double,_1,_4,_1,_1,_4> b31;
  Matrix<double,_1,_4,_1,_1,_4> b21;
  Matrix<double,_1,_4,_1,_1,_4> b11;
  Matrix<double,_1,_7,_1,_1,_7> p3;
  Matrix<double,_1,_5,_1,_1,_5> b33;
  Matrix<double,_1,_8,_1,_1,_8> p2;
  Matrix<double,_1,_8,_1,_1,_8> p1;
  Matrix<double,_1,_5,_1,_1,_5> b23;
  Matrix<double,_1,_5,_1,_1,_5> b13;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part1;
  Matrix<double,_1,_8,_1,_1,_8> p2_part2;
  Matrix<double,_1,_8,_1,_1,_8> p2_part1;
  Matrix<double,_1,_8,_1,_1,_8> p1_part2;
  Matrix<double,_1,_8,_1,_1,_8> p1_part1;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part3;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part1;
  Matrix<double,_10,_20,_0,_10,_20> A;
  Matrix<double,_10,_10,_0,_10,_10> A3;
  Matrix<double,_10,_10,_0,_10,_10> A2;
  DenseStorage<double,__1,__1,__1,_0> local_1af0;
  vector<double,_std::allocator<double>_> local_1ad8;
  DenseStorage<double,__1,__1,__1,_0> local_1ac0;
  Matrix<double,_3,_3,_0,_3,_3> local_1aa0;
  DenseStorage<double,__1,__1,__1,_0> local_1a50;
  double local_1a30;
  double local_1a28;
  double local_1a20;
  double local_1a18;
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *local_1a10;
  Sturm local_1a08;
  DenseStorage<double,_4,_1,_4,_1> local_19e0;
  double local_19c0 [4];
  double local_19a0;
  double dStack_1998;
  double local_1990;
  double dStack_1988;
  double local_1980;
  double dStack_1978;
  double local_1970;
  DenseStorage<double,_4,_1,_4,_1> local_1960;
  DenseStorage<double,_4,_1,_4,_1> local_1940;
  DenseStorage<double,_4,_1,_4,_1> local_1920;
  DenseStorage<double,_4,_1,_4,_1> local_1900;
  DenseStorage<double,_4,_1,_4,_1> local_18e0;
  undefined1 local_18b0 [32];
  undefined1 local_1890 [16];
  double local_1880;
  undefined1 local_1870 [16];
  undefined1 local_1860 [16];
  double local_1850;
  DenseStorage<double,_8,_1,_8,_1> local_1840;
  DenseStorage<double,_8,_1,_8,_1> local_1800;
  undefined1 local_17c0 [16];
  undefined1 local_17b0 [16];
  double local_17a0;
  undefined1 local_1790 [16];
  undefined1 local_1780 [16];
  double local_1770;
  Matrix<double,_1,_11,_1,_1,_11> local_1760;
  undefined1 local_1700 [16];
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [16];
  double local_16d0;
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [16];
  undefined1 local_16a0 [16];
  double local_1690;
  PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> local_1680;
  PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> local_1640;
  plain_array<double,_8,_1,_64> local_1600;
  plain_array<double,_8,_1,_64> local_15c0;
  Matrix<double,_1,_11,_1,_1,_11> local_1580;
  Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_> local_1520;
  Matrix<double,_10,_10,_0,_10,_10> *local_1120;
  Matrix<double,_10,_20,_0,_10,_20> local_1100;
  undefined1 local_ac0 [592];
  double local_870;
  double dStack_868;
  double local_860;
  double dStack_858;
  double local_850;
  double dStack_848;
  double local_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  undefined1 local_7f8 [16];
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  Matrix<double,_10,_10,_0,_10,_10> local_7a0;
  FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_480;
  
  local_1a10 = (vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)essentials;
  fivept_nister::composeA(EE,&local_1100);
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[100];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [1] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x65];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [2] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x66];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [3] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x67];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [4] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x68];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [5] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x69];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [6] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [7] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [8] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [9] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
         m_data.array[0x6e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xb] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x6f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xc] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x70];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xd] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x71];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xe] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x72];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xf] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x73];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x74];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x11] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x75];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x12] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x76];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x13] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x77];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x14] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x78];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x15] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x79];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x16] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x17] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x18] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x19] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x80];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x81];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x82];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x83];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x20] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x84];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x21] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x85];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x22] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x86];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x23] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x87];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x24] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x88];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x25] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x89];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x26] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x27] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x28] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x29] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x90];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x91];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x92];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x93];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x30] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x94];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x31] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x95];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x32] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x96];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x33] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x97];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x34] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x98];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x35] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x99];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x36] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x37] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x38] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x39] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa3];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x40] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x41] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x42] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x43] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa7];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x44] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa8];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x45] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa9];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x46] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xaa];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x47] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xab];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x48] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xac];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x49] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xad];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xae];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xaf];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb3];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x50] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x51] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x52] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x53] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb7];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x54] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb8];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x55] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb9];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x56] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xba];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x57] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbb];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x58] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbc];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x59] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbd];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbe];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbf];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc3];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x60] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x61] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x62] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [99] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
         m_data.array[199];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[0];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[1];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[2];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[3];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[4] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[4];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[5] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[5];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[6] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[6];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[7] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[7];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[8] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[8];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[9] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[9];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
              m_data.array[10];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xb] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xb];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xc] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xc];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xd] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xd];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xe] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xe];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xf] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xf];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x10];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x11] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x11];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x12] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x12];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x13] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x13];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x14] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x14];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x15] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x15];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x16] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x16];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x17] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x17];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x18] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x18];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x19] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x19];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x20] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x20];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x21] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x21];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x22] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x22];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x23] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x23];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x24] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x24];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x25] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x25];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x26] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x26];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x27] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x27];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x28] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x28];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x29] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x29];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x30] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x30];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x31] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x31];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x32] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x32];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x33] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x33];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x34] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x34];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x35] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x35];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x36] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x36];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x37] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x37];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x38] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x38];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x39] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x39];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x40] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x40];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x41] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x41];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x42] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x42];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x43] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x43];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x44] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x44];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x45] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x45];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x46] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x46];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x47] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x47];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x48] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x48];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x49] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x49];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x50] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x50];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x51] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x51];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x52] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x52];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x53] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x53];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x54] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x54];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x55] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x55];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x56] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x56];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x57] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x57];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x58] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x58];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x59] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x59];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x60] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x60];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x61] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x61];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x62] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x62];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[99] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
              m_data.array[99];
  local_480.m_isInitialized = false;
  local_480.m_usePrescribedThreshold = false;
  Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::computeInPlace(&local_480);
  memcpy(&local_1520,&local_480,800);
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[0];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[1];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[2];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[3];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[4];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[5];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[6];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[7];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[8];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[9];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[0];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[1];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[2];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[3];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[4];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[5];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[6];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[7];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[8];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[9];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[0];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[1];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[2];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[3];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[4];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[5];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[6];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[7];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[8];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[9];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[0] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[0];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[1] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[1];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[2] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[2];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[3] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[3];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[4] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[4];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[5] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[5];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[6] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[6];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[7] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[7];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[8] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[8];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[9] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[9];
  local_1520.m_xpr.m_nonzero_pivots = local_480.m_nonzero_pivots;
  local_1520.m_xpr.m_l1_norm = local_480.m_l1_norm;
  local_1520.m_xpr.m_maxpivot = local_480.m_maxpivot;
  local_1520.m_xpr._992_3_ =
       SUB43(CONCAT22(local_480._993_2_,
                      CONCAT11(local_480.m_det_pq,local_480.m_prescribedThreshold._7_1_)) >> 8,0);
  local_1520.m_xpr.m_prescribedThreshold._7_1_ = local_480.m_prescribedThreshold._7_1_;
  local_1120 = &local_7a0;
  memset((Matrix<double,_10,_10,_0,_10,_10> *)local_ac0,0,800);
  local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>>,Eigen::Matrix<double,10,10,0,10,10>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)local_ac0,&local_1520,&local_7a0,
             (Scalar *)&local_1760);
  auVar9 = vmovhpd_avx(ZEXT816(0) << 0x40,local_ac0._32_8_);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_ac0._40_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_ac0._56_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_ac0._112_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_ac0._128_8_;
  auVar10 = vmovhpd_avx(auVar62,local_ac0._192_8_);
  auVar38._16_16_ = auVar10;
  auVar38._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar44,local_ac0._120_8_);
  auVar50._16_8_ = local_ac0._200_8_;
  auVar50._0_16_ = auVar9;
  auVar50._24_8_ = 0;
  local_18e0.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar38,auVar50);
  auVar9 = vmovhpd_avx(ZEXT816(0),local_ac0._48_8_);
  auVar10 = vmovhpd_avx(auVar63,local_ac0._208_8_);
  auVar39._16_16_ = auVar10;
  auVar39._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar56,local_ac0._136_8_);
  auVar51._16_8_ = local_ac0._216_8_;
  auVar51._0_16_ = auVar9;
  auVar51._24_8_ = 0;
  local_1900.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar39,auVar51);
  auVar9 = vmovhpd_avx(ZEXT816(0),local_ac0._64_8_);
  auVar44 = ZEXT816(0);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_ac0._72_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_ac0._144_8_;
  auVar10 = vmovhpd_avx(auVar57,local_ac0._224_8_);
  auVar40._16_16_ = auVar10;
  auVar40._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar45,local_ac0._152_8_);
  auVar52._16_8_ = local_ac0._232_8_;
  auVar52._0_16_ = auVar9;
  auVar52._24_8_ = 0;
  local_1920.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar40,auVar52);
  auVar9 = vmovhpd_avx(auVar44,local_ac0._272_8_);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_ac0._280_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_ac0._352_8_;
  auVar10 = vmovhpd_avx(auVar58,local_ac0._432_8_);
  auVar41._16_16_ = auVar10;
  auVar41._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar46,local_ac0._360_8_);
  auVar53._16_8_ = local_ac0._440_8_;
  auVar53._0_16_ = auVar9;
  auVar53._24_8_ = 0;
  local_1940.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar41,auVar53);
  auVar9 = vmovhpd_avx(auVar44,local_ac0._288_8_);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_ac0._296_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_ac0._368_8_;
  auVar10 = vmovhpd_avx(auVar59,local_ac0._448_8_);
  auVar42._16_16_ = auVar10;
  auVar42._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar47,local_ac0._376_8_);
  auVar54._16_8_ = local_ac0._456_8_;
  auVar54._0_16_ = auVar9;
  auVar54._24_8_ = 0;
  local_19e0.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar42,auVar54);
  auVar9 = vmovhpd_avx(auVar44,local_ac0._304_8_);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_ac0._312_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_ac0._384_8_;
  auVar10 = vmovhpd_avx(auVar60,local_ac0._464_8_);
  auVar43._16_16_ = auVar10;
  auVar43._0_16_ = auVar9;
  auVar9 = vmovhpd_avx(auVar48,local_ac0._392_8_);
  auVar55._16_8_ = local_ac0._472_8_;
  auVar55._0_16_ = auVar9;
  auVar55._24_8_ = 0;
  local_1960.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar43,auVar55);
  auVar9._8_8_ = dStack_868;
  auVar9._0_8_ = local_870;
  auVar9 = vmovhpd_avx(auVar9,local_820);
  auVar10 = vmovhpd_avx(auVar44,local_ac0._512_8_);
  auVar11._8_8_ = local_ac0._528_8_;
  auVar11._0_8_ = local_ac0._520_8_;
  auVar11 = vmovhpd_avx(auVar11,dStack_868);
  local_1790 = vsubpd_avx(auVar10,auVar11);
  auVar14._8_8_ = dStack_810;
  auVar14._0_8_ = local_818;
  auVar10 = vmovhpd_avx(auVar14,local_7c8);
  local_1780 = vsubpd_avx(auVar9,auVar10);
  local_1770 = local_7d0;
  auVar10._8_8_ = dStack_858;
  auVar10._0_8_ = local_860;
  auVar9 = vmovhpd_avx(auVar10,dStack_810);
  auVar10 = vmovhpd_avx(auVar44,local_ac0._528_8_);
  auVar12._8_8_ = local_ac0._544_8_;
  auVar12._0_8_ = local_ac0._536_8_;
  auVar11 = vmovhpd_avx(auVar12,dStack_858);
  local_17c0 = vsubpd_avx(auVar10,auVar11);
  auVar15._8_8_ = dStack_800;
  auVar15._0_8_ = local_808;
  auVar10 = vmovhpd_avx(auVar15,local_7b8);
  local_17b0 = vsubpd_avx(auVar9,auVar10);
  local_17a0 = local_7c0;
  auVar13._8_8_ = dStack_848;
  auVar13._0_8_ = local_850;
  auVar9 = vmovhpd_avx(auVar13,dStack_800);
  auVar10 = vmovhpd_avx(auVar44,local_ac0._544_8_);
  auVar11 = vmovhpd_avx(local_ac0._552_16_,dStack_848);
  local_1870 = vsubpd_avx(auVar10,auVar11);
  auVar10 = vmovhpd_avx(local_7f8,local_7a8);
  local_1860 = vsubpd_avx(auVar9,auVar10);
  local_1850 = local_7b0;
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_17c0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1940,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_15c0);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_1790,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19e0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1600);
  local_1800.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_15c0.array,(undefined1  [64])local_1600.array);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_1790,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1900,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1640);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_17c0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_18e0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1680);
  local_1840.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_1640.m_storage.m_data.array,
                      (undefined1  [64])local_1680.m_storage.m_data.array);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_18e0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19e0,
             (Matrix<double,_1,_7,_1,_1,_7> *)local_16c0);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_1940,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1900,
             (Matrix<double,_1,_7,_1,_1,_7> *)local_1700);
  local_18b0._0_16_ = vsubpd_avx(local_16c0,local_1700);
  local_18b0._16_16_ = vsubpd_avx(local_16b0,local_16f0);
  local_1890 = vsubpd_avx(local_16a0,local_16e0);
  local_1880 = local_1690 - local_16d0;
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1800,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1920,
             (Matrix<double,_1,_11,_1,_1,_11> *)&local_1520);
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1840,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1960,&local_1760);
  fivept_nister::computeTenthOrderPolynomialFrom64
            ((Matrix<double,_1,_7,_1,_1,_7> *)local_18b0,(Matrix<double,_1,_5,_1,_1,_5> *)local_1870
             ,&local_1580);
  local_19c0[0] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[0] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[0] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[0];
  local_19c0[1] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[1] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[1] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[1];
  local_19c0[2] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[2] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[2] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[2];
  local_19c0[3] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[3] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[3] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[3];
  local_19a0 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[4] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[4] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[4];
  dStack_1998 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[5] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[5] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[5];
  local_1990 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[6] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[6] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[6];
  dStack_1988 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[7] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[7] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[7];
  local_1980 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[8] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[8] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[8];
  dStack_1978 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[9] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[9] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[9];
  local_1970 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[10] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[10] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[10];
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,0xb,1,0xb);
  if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[1] != 4.94065645841247e-324) ||
     (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] != 5.43472210425371e-323)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,0xb,1,0xb);
  }
  if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2]) {
    auVar31 = vpbroadcastq_avx512f();
    dVar23 = 0.0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pdVar16 = (double *)
              local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
    do {
      if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[1]) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_19c0[(long)dVar23];
        auVar33 = vbroadcastsd_avx512f(auVar1);
        uVar27 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar34 = vporq_avx512f(auVar34,auVar32);
          uVar30 = vpcmpuq_avx512f(auVar34,auVar31,2);
          pdVar26 = pdVar16 + uVar27;
          bVar2 = (bool)((byte)uVar30 & 1);
          bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar30 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar30 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar30 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar30 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar30 >> 6) & 1);
          *pdVar26 = (double)((ulong)bVar2 * auVar33._0_8_ | (ulong)!bVar2 * (long)*pdVar26);
          pdVar26[1] = (double)((ulong)bVar3 * auVar33._8_8_ | (ulong)!bVar3 * (long)pdVar26[1]);
          pdVar26[2] = (double)((ulong)bVar4 * auVar33._16_8_ | (ulong)!bVar4 * (long)pdVar26[2]);
          pdVar26[3] = (double)((ulong)bVar5 * auVar33._24_8_ | (ulong)!bVar5 * (long)pdVar26[3]);
          pdVar26[4] = (double)((ulong)bVar6 * auVar33._32_8_ | (ulong)!bVar6 * (long)pdVar26[4]);
          pdVar26[5] = (double)((ulong)bVar7 * auVar33._40_8_ | (ulong)!bVar7 * (long)pdVar26[5]);
          pdVar26[6] = (double)((ulong)bVar8 * auVar33._48_8_ | (ulong)!bVar8 * (long)pdVar26[6]);
          pdVar26[7] = (double)((uVar30 >> 7) * auVar33._56_8_ |
                               (ulong)!SUB81(uVar30 >> 7,0) * (long)pdVar26[7]);
          uVar27 = uVar27 + 8;
        } while (((long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1] + 7U & 0xfffffffffffffff8) != uVar27);
      }
      dVar23 = (double)((long)dVar23 + 1);
      pdVar16 = pdVar16 + (long)local_1aa0.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[1];
    } while (dVar23 != local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[2]);
  }
  math::Sturm::Sturm(&local_1a08,(MatrixXd *)&local_1aa0);
  if ((double *)
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] != (double *)0x0) {
    free(*(void **)((long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0] + -8));
  }
  math::Sturm::findRoots(&local_1ad8,&local_1a08);
  lVar18 = (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_1a50.m_data = (double *)0x0;
  local_1a50.m_rows = 0;
  local_1a50.m_cols = 0;
  if ((local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar18),0) < 9)) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = acos;
    __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1a50,lVar18 * 9,9,lVar18);
  if (local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar27 = 0;
  }
  else {
    lVar18 = 0;
    uVar30 = 0;
    do {
      local_1ac0.m_data =
           (double *)
           local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar30];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] != 4.94065645841247e-324) ||
         (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] != 3.95252516672997e-323)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      }
      if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[2]) {
        dVar23 = 0.0;
        pdVar16 = (double *)
                  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        do {
          if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1]) {
            dVar24 = 0.0;
            do {
              pdVar16[(long)dVar24] = local_1800.m_data.array[(long)dVar23];
              dVar24 = (double)((long)dVar24 + 1);
            } while (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1] != dVar24);
          }
          dVar23 = (double)((long)dVar23 + 1);
          pdVar16 = pdVar16 + (long)local_1aa0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[1];
        } while (dVar23 != local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[2]);
      }
      local_1a28 = fivept_nister::polyVal((MatrixXd *)&local_1aa0,(double)local_1ac0.m_data);
      local_1af0.m_data = (double *)0x0;
      local_1af0.m_rows = 0;
      local_1af0.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1af0,7,1,7);
      if ((local_1af0.m_rows != 1) || (local_1af0.m_cols != 7)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1af0,7,1,7);
      }
      if (0 < local_1af0.m_cols) {
        lVar21 = 0;
        pdVar16 = local_1af0.m_data;
        do {
          if (0 < local_1af0.m_rows) {
            lVar25 = 0;
            do {
              pdVar16[lVar25] = *(double *)(local_18b0 + lVar21 * 8);
              lVar25 = lVar25 + 1;
            } while (local_1af0.m_rows != lVar25);
          }
          lVar21 = lVar21 + 1;
          pdVar16 = pdVar16 + local_1af0.m_rows;
        } while (lVar21 != local_1af0.m_cols);
      }
      local_1a30 = fivept_nister::polyVal((MatrixXd *)&local_1af0,(double)local_1ac0.m_data);
      if (local_1af0.m_data != (double *)0x0) {
        free((void *)local_1af0.m_data[-1]);
      }
      if ((double *)
          local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        free(*(void **)((long)local_1aa0.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
      local_1a18 = local_1a28 / local_1a30;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] != 4.94065645841247e-324) ||
         (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] != 3.95252516672997e-323)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      }
      if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[2]) {
        dVar23 = 0.0;
        pdVar16 = (double *)
                  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        do {
          if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1]) {
            dVar24 = 0.0;
            do {
              pdVar16[(long)dVar24] = local_1840.m_data.array[(long)dVar23];
              dVar24 = (double)((long)dVar24 + 1);
            } while (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1] != dVar24);
          }
          dVar23 = (double)((long)dVar23 + 1);
          pdVar16 = pdVar16 + (long)local_1aa0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[1];
        } while (dVar23 != local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[2]);
      }
      local_1a28 = fivept_nister::polyVal((MatrixXd *)&local_1aa0,(double)local_1ac0.m_data);
      local_1af0.m_data = (double *)0x0;
      local_1af0.m_rows = 0;
      local_1af0.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1af0,7,1,7);
      if ((local_1af0.m_rows != 1) || (local_1af0.m_cols != 7)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1af0,7,1,7);
      }
      if (0 < local_1af0.m_cols) {
        lVar21 = 0;
        pdVar16 = local_1af0.m_data;
        do {
          if (0 < local_1af0.m_rows) {
            lVar25 = 0;
            do {
              pdVar16[lVar25] = *(double *)(local_18b0 + lVar21 * 8);
              lVar25 = lVar25 + 1;
            } while (local_1af0.m_rows != lVar25);
          }
          lVar21 = lVar21 + 1;
          pdVar16 = pdVar16 + local_1af0.m_rows;
        } while (lVar21 != local_1af0.m_cols);
      }
      local_1a30 = fivept_nister::polyVal((MatrixXd *)&local_1af0,(double)local_1ac0.m_data);
      if (local_1af0.m_data != (double *)0x0) {
        free((void *)local_1af0.m_data[-1]);
      }
      if ((double *)
          local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        free(*(void **)((long)local_1aa0.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
      local_1a20 = local_1a28 / local_1a30;
      fivept_nister::pollishCoefficients(&local_1100,&local_1a18,&local_1a20,(double *)&local_1ac0);
      uVar27 = local_1a50.m_rows;
      if ((((ulong)(local_1a50.m_data + local_1a50.m_rows * uVar30) & 7) == 0) &&
         (uVar27 = (ulong)(-((uint)((ulong)(local_1a50.m_data + local_1a50.m_rows * uVar30) >> 3) &
                            0x1fffffff) & 7), local_1a50.m_rows <= (long)uVar27)) {
        uVar27 = local_1a50.m_rows;
      }
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_1a18;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1a20;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_1ac0.m_data;
      uVar22 = local_1a50.m_rows - uVar27;
      uVar19 = uVar22 + 7;
      if (-1 < (long)uVar22) {
        uVar19 = uVar22;
      }
      if (0 < (long)uVar27) {
        uVar28 = 0;
        do {
          *(double *)((long)local_1a50.m_data + uVar28 * 8 + local_1a50.m_rows * lVar18) =
               local_1a18 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar28] +
               local_1a20 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar28 + 9] +
               (double)local_1ac0.m_data *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar28 + 0x12] +
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar28 + 0x1b];
          uVar28 = uVar28 + 1;
        } while (uVar27 != uVar28);
      }
      uVar19 = (uVar19 & 0xfffffffffffffff8) + uVar27;
      if (7 < (long)uVar22) {
        auVar31 = vbroadcastsd_avx512f(auVar36);
        auVar32 = vbroadcastsd_avx512f(auVar49);
        auVar33 = vbroadcastsd_avx512f(auVar61);
        do {
          auVar34 = vmulpd_avx512f(auVar31,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27));
          auVar35 = vmulpd_avx512f(auVar32,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 9));
          auVar34 = vaddpd_avx512f(auVar34,auVar35);
          auVar35 = vmulpd_avx512f(auVar33,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 0x12));
          auVar34 = vaddpd_avx512f(auVar34,auVar35);
          auVar34 = vaddpd_avx512f(auVar34,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 0x1b));
          *(undefined1 (*) [64])((long)local_1a50.m_data + uVar27 * 8 + local_1a50.m_rows * lVar18)
               = auVar34;
          uVar27 = uVar27 + 8;
        } while ((long)uVar27 < (long)uVar19);
      }
      if ((long)uVar19 < local_1a50.m_rows) {
        do {
          *(double *)((long)local_1a50.m_data + uVar19 * 8 + local_1a50.m_rows * lVar18) =
               local_1a18 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar19] +
               local_1a20 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar19 + 9] +
               (double)local_1ac0.m_data *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar19 + 0x12] +
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar19 + 0x1b];
          uVar19 = uVar19 + 1;
        } while (local_1a50.m_rows != uVar19);
      }
      uVar30 = uVar30 + 1;
      uVar27 = (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar18 = lVar18 + 8;
    } while (uVar30 < uVar27);
  }
  local_1af0.m_data = (double *)0x0;
  local_1af0.m_rows = 0;
  local_1af0.m_cols = 0;
  if ((local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar27),0) < 1)) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = acos;
    __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1af0,uVar27,1,uVar27);
  this = local_1a10;
  if (local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar27 = 0;
  }
  else {
    lVar18 = 0;
    uVar30 = 0;
    do {
      local_1af0.m_data[local_1af0.m_rows * uVar30] = 0.0;
      dVar23 = local_1af0.m_data[local_1af0.m_rows * uVar30];
      lVar21 = 0;
      do {
        dVar24 = *(double *)((long)local_1a50.m_data + lVar21 * 8 + local_1a50.m_rows * lVar18);
        dVar23 = dVar24 * dVar24 + dVar23;
        local_1af0.m_data[local_1af0.m_rows * uVar30] = dVar23;
        lVar21 = lVar21 + 1;
      } while (lVar21 != 9);
      dVar23 = local_1af0.m_data[local_1af0.m_rows * uVar30];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar23;
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        auVar9 = vsqrtsd_avx(auVar37,auVar37);
        dVar23 = auVar9._0_8_;
      }
      local_1af0.m_data[local_1af0.m_rows * uVar30] = dVar23;
      uVar30 = uVar30 + 1;
      uVar27 = (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar18 = lVar18 + 8;
    } while (uVar30 < uVar27);
  }
  local_1ac0.m_data = (double *)0x0;
  local_1ac0.m_rows = 0;
  local_1ac0.m_cols = 0;
  if ((local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar27),0) < 9)) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = acos;
    __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1ac0,uVar27 * 9,9,uVar27);
  lVar18 = 0;
  pdVar16 = local_1ac0.m_data;
  do {
    pdVar26 = pdVar16;
    pdVar20 = local_1af0.m_data;
    lVar21 = local_1ac0.m_cols;
    if (0 < local_1ac0.m_cols) {
      do {
        *pdVar26 = *pdVar20;
        lVar21 = lVar21 + -1;
        pdVar26 = pdVar26 + local_1ac0.m_rows;
        pdVar20 = pdVar20 + local_1af0.m_rows;
      } while (lVar21 != 0);
    }
    lVar18 = lVar18 + 1;
    pdVar16 = pdVar16 + 1;
  } while (lVar18 != 9);
  lVar18 = (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  lVar21 = 0;
  pdVar16 = local_1a50.m_data;
  pdVar26 = local_1ac0.m_data;
  do {
    pdVar20 = pdVar16;
    pdVar29 = pdVar26;
    lVar25 = lVar18 + (ulong)(lVar18 == 0);
    if (local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        *pdVar20 = *pdVar20 / *pdVar29;
        pdVar20 = pdVar20 + local_1a50.m_rows;
        pdVar29 = pdVar29 + local_1ac0.m_rows;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    lVar21 = lVar21 + 1;
    pdVar16 = pdVar16 + 1;
    pdVar26 = pdVar26 + 1;
  } while (lVar21 != 9);
  if (local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar27 = 0;
    do {
      lVar18 = local_1a50.m_rows * uVar27;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = local_1a50.m_data[lVar18];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = local_1a50.m_data[lVar18 + 1];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = local_1a50.m_data[lVar18 + 2];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = local_1a50.m_data[lVar18 + 3];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = local_1a50.m_data[lVar18 + 4];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = local_1a50.m_data[lVar18 + 5];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_1a50.m_data[lVar18 + 6];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = local_1a50.m_data[lVar18 + 7];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = local_1a50.m_data[lVar18 + 8];
      __position._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (__position._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(this,__position,&local_1aa0);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        *(long *)(this + 8) = *(long *)(this + 8) + 0x48;
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)((long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1ad8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_1ac0.m_data != (double *)0x0) {
    free((void *)local_1ac0.m_data[-1]);
  }
  if (local_1af0.m_data != (double *)0x0) {
    free((void *)local_1af0.m_data[-1]);
  }
  if (local_1a50.m_data != (double *)0x0) {
    free((void *)local_1a50.m_data[-1]);
  }
  if (local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1ad8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  math::Sturm::~Sturm(&local_1a08);
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister_main(
    const Eigen::Matrix<double,9,4> & EE,
    essentials_t & essentials )
{
  Eigen::Matrix<double,10,20> A;
  fivept_nister::composeA(EE,A);

  Eigen::Matrix<double,10,10> A1 = A.block(0,0,10,10);
  Eigen::Matrix<double,10,10> A2 = A.block(0,10,10,10);

  Eigen::FullPivLU< Eigen::Matrix<double,10,10> > luA1(A1);
  Eigen::Matrix<double,10,10> A3 = luA1.inverse()*A2;

  Eigen::Matrix<double,1,4> b11_part1 = Eigen::Matrix<double,1,4>::Zero();
  b11_part1.block<1,3>(0,1) = A3.block<1,3>(4,0);
  Eigen::Matrix<double,1,4> b11_part2 = Eigen::Matrix<double,1,4>::Zero();
  b11_part2.block<1,3>(0,0) = A3.block<1,3>(5,0);
  Eigen::Matrix<double,1,4> b11 = b11_part1 - b11_part2;

  Eigen::Matrix<double,1,4> b21_part1 = Eigen::Matrix<double,1,4>::Zero();
  b21_part1.block<1,3>(0,1) = A3.block<1,3>(6,0);
  Eigen::Matrix<double,1,4> b21_part2 = Eigen::Matrix<double,1,4>::Zero();
  b21_part2.block<1,3>(0,0) = A3.block<1,3>(7,0);
  Eigen::Matrix<double,1,4> b21 = b21_part1 - b21_part2;

  Eigen::Matrix<double,1,4> b31_part1 = Eigen::Matrix<double,1,4>::Zero();
  b31_part1.block<1,3>(0,1) = A3.block<1,3>(8,0);
  Eigen::Matrix<double,1,4> b31_part2 = Eigen::Matrix<double,1,4>::Zero();
  b31_part2.block<1,3>(0,0) = A3.block<1,3>(9,0);
  Eigen::Matrix<double,1,4> b31 = b31_part1 - b31_part2;

  Eigen::Matrix<double,1,4> b12_part1 = Eigen::Matrix<double,1,4>::Zero();
  b12_part1.block<1,3>(0,1) = A3.block<1,3>(4,3);
  Eigen::Matrix<double,1,4> b12_part2 = Eigen::Matrix<double,1,4>::Zero();
  b12_part2.block<1,3>(0,0) = A3.block<1,3>(5,3);
  Eigen::Matrix<double,1,4> b12 = b12_part1 - b12_part2;

  Eigen::Matrix<double,1,4> b22_part1 = Eigen::Matrix<double,1,4>::Zero();
  b22_part1.block<1,3>(0,1) = A3.block<1,3>(6,3);
  Eigen::Matrix<double,1,4> b22_part2 = Eigen::Matrix<double,1,4>::Zero();
  b22_part2.block<1,3>(0,0) = A3.block<1,3>(7,3);
  Eigen::Matrix<double,1,4> b22 = b22_part1 - b22_part2;

  Eigen::Matrix<double,1,4> b32_part1 = Eigen::Matrix<double,1,4>::Zero();
  b32_part1.block<1,3>(0,1) = A3.block<1,3>(8,3);
  Eigen::Matrix<double,1,4> b32_part2 = Eigen::Matrix<double,1,4>::Zero();
  b32_part2.block<1,3>(0,0) = A3.block<1,3>(9,3);
  Eigen::Matrix<double,1,4> b32 = b32_part1 - b32_part2;

  Eigen::Matrix<double,1,5> b13_part1 = Eigen::Matrix<double,1,5>::Zero();
  b13_part1.block<1,4>(0,1) = A3.block<1,4>(4,6);
  Eigen::Matrix<double,1,5> b13_part2 = Eigen::Matrix<double,1,5>::Zero();
  b13_part2.block<1,4>(0,0) = A3.block<1,4>(5,6);
  Eigen::Matrix<double,1,5> b13 = b13_part1 - b13_part2;

  Eigen::Matrix<double,1,5> b23_part1 = Eigen::Matrix<double,1,5>::Zero();
  b23_part1.block<1,4>(0,1) = A3.block<1,4>(6,6);
  Eigen::Matrix<double,1,5> b23_part2 = Eigen::Matrix<double,1,5>::Zero();
  b23_part2.block<1,4>(0,0) = A3.block<1,4>(7,6);
  Eigen::Matrix<double,1,5> b23 = b23_part1 - b23_part2;

  Eigen::Matrix<double,1,5> b33_part1 = Eigen::Matrix<double,1,5>::Zero();
  b33_part1.block<1,4>(0,1) = A3.block<1,4>(8,6);
  Eigen::Matrix<double,1,5> b33_part2 = Eigen::Matrix<double,1,5>::Zero();
  b33_part2.block<1,4>(0,0) = A3.block<1,4>(9,6);
  Eigen::Matrix<double,1,5> b33 = b33_part1 - b33_part2;

  Eigen::Matrix<double,1,8> p1_part1;
  fivept_nister::computeSeventhOrderPolynomial(b23,b12,p1_part1);
  Eigen::Matrix<double,1,8> p1_part2;
  fivept_nister::computeSeventhOrderPolynomial(b13,b22,p1_part2);
  Eigen::Matrix<double,1,8> p1 = p1_part1 - p1_part2;
  Eigen::Matrix<double,1,8> p2_part1;
  fivept_nister::computeSeventhOrderPolynomial(b13,b21,p2_part1);
  Eigen::Matrix<double,1,8> p2_part2;
  fivept_nister::computeSeventhOrderPolynomial(b23,b11,p2_part2);
  Eigen::Matrix<double,1,8> p2 = p2_part1 - p2_part2;
  Eigen::Matrix<double,1,7> p3_part1;
  fivept_nister::computeSixthOrderPolynomial(b11,b22,p3_part1);
  Eigen::Matrix<double,1,7> p3_part2;
  fivept_nister::computeSixthOrderPolynomial(b12,b21,p3_part2);
  Eigen::Matrix<double,1,7> p3 = p3_part1 - p3_part2;

  Eigen::Matrix<double,1,11> p_order10_part1;
  fivept_nister::computeTenthOrderPolynomialFrom73(p1,b31,p_order10_part1);
  Eigen::Matrix<double,1,11> p_order10_part2;
  fivept_nister::computeTenthOrderPolynomialFrom73(p2,b32,p_order10_part2);
  Eigen::Matrix<double,1,11> p_order10_part3;
  fivept_nister::computeTenthOrderPolynomialFrom64(p3,b33,p_order10_part3);
  Eigen::Matrix<double,1,11> p_order10 =
      p_order10_part1 + p_order10_part2 + p_order10_part3;

  math::Sturm sturmSequence(p_order10);
  std::vector<double> roots = sturmSequence.findRoots();

  Eigen::MatrixXd Evec(9,roots.size());

  for( size_t i = 0; i < roots.size(); i++ )
  {
    double z = roots[i];
    double x = fivept_nister::polyVal(p1,z)/fivept_nister::polyVal(p3,z);
    double y = fivept_nister::polyVal(p2,z)/fivept_nister::polyVal(p3,z);

    //pollishing here
    fivept_nister::pollishCoefficients(A,x,y,z);

    Evec.col(i) = x*EE.col(0) + y*EE.col(1) + z*EE.col(2) + EE.col(3);
  }

  Eigen::MatrixXd norms(1,roots.size());
  for( size_t c = 0; c < roots.size(); c++ )
  {
    norms(0,c) = 0.0;

    for( int r = 0; r < 9; r++ )
      norms(0,c) += pow( Evec(r,c), 2 );

    norms(0,c) = sqrt(norms(0,c));
  }

  Eigen::MatrixXd EvecNorms(9,roots.size());
  for( size_t i = 0; i < 9; i++ )
    EvecNorms.row(i) = norms;

  for( size_t r = 0; r < 9; r++ )
  {
    for( size_t c = 0; c < roots.size(); c++ )
      Evec(r,c) = Evec(r,c) / EvecNorms(r,c);
  }

  for( size_t c = 0; c < roots.size(); c++ )
  {
    essential_t essential;

    essential.row(0) = Evec.block<3,1>(0,c).transpose();
    essential.row(1) = Evec.block<3,1>(3,c).transpose();
    essential.row(2) = Evec.block<3,1>(6,c).transpose();

    essentials.push_back(essential);
  }
}